

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_format.cc
# Opt level: O2

string * __thiscall
absl::lts_20250127::log_internal::FormatLogMessage_abi_cxx11_
          (string *__return_storage_ptr__,log_internal *this,LogSeverity severity,
          CivilSecond civil_second,Duration subsecond,Tid tid,string_view basename,int line,
          PrefixFormat format,string_view message)

{
  char *args;
  undefined8 extraout_RDX;
  Duration d;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  char *local_50;
  int64_t local_48;
  FormatSpec<char,_int,_int,_int,_int,_int,_long,_int,_std::basic_string_view<char>,_int,_const_char_*,_std::basic_string_view<char>_>
  local_40;
  
  d.rep_hi_.hi_ = 0;
  d.rep_hi_.lo_ = tid;
  local_40.super_type.spec_.data_ = "%c%02d%02d %02d:%02d:%02d.%06d %7d %s:%d] %s%s";
  local_40.super_type.spec_.size_ = 0x2e;
  args = LogSeverityName((LogSeverity)this);
  local_54 = (int)(char)civil_second.f_.y;
  local_58 = (int)civil_second.f_.y._1_1_;
  local_5c = (int)civil_second.f_.y._2_1_;
  local_60 = (int)civil_second.f_.y >> 0x18;
  local_64 = civil_second.f_.y._1_4_ >> 0x18;
  d.rep_lo_ = (uint32_t)extraout_RDX;
  local_48 = ToInt64Microseconds(civil_second.f_._8_8_,d);
  local_50 = "";
  if (line == 1) {
    local_50 = "RAW: ";
  }
  StrFormat<char,_int,_int,_int,_int,_int,_long,_int,_std::basic_string_view<char,_std::char_traits<char>_>,_int,_const_char_*,_std::basic_string_view<char,_std::char_traits<char>_>_>
            (__return_storage_ptr__,&local_40,args,&local_54,&local_58,&local_5c,&local_60,&local_64
             ,&local_48,(int *)&subsecond,
             (basic_string_view<char,_std::char_traits<char>_> *)&subsecond.rep_lo_,
             (int *)&basename._M_str,&local_50,
             (basic_string_view<char,_std::char_traits<char>_> *)&format);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatLogMessage(absl::LogSeverity severity,
                             absl::CivilSecond civil_second,
                             absl::Duration subsecond, log_internal::Tid tid,
                             absl::string_view basename, int line,
                             PrefixFormat format, absl::string_view message) {
  return absl::StrFormat(
      "%c%02d%02d %02d:%02d:%02d.%06d %7d %s:%d] %s%s",
      absl::LogSeverityName(severity)[0], civil_second.month(),
      civil_second.day(), civil_second.hour(), civil_second.minute(),
      civil_second.second(), absl::ToInt64Microseconds(subsecond), tid,
      basename, line, format == PrefixFormat::kRaw ? "RAW: " : "", message);
}